

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O2

_Bool sysbvm_methodDictionary_find
                (sysbvm_tuple_t dictionary,sysbvm_tuple_t element,sysbvm_tuple_t *outValue)

{
  intptr_t iVar1;
  
  *outValue = 0;
  if ((((dictionary & 0xf) == 0 && dictionary != 0) &&
      (iVar1 = sysbvm_methodDictionary_scanFor(dictionary,element), -1 < iVar1)) &&
     (*(long *)(*(long *)(dictionary + 0x18) + 0x10 + iVar1 * 0x10) != 0x3f)) {
    *outValue = *(sysbvm_tuple_t *)(*(long *)(dictionary + 0x18) + 0x18 + iVar1 * 0x10);
    return true;
  }
  return false;
}

Assistant:

SYSBVM_API bool sysbvm_methodDictionary_find(sysbvm_tuple_t dictionary, sysbvm_tuple_t element, sysbvm_tuple_t *outValue)
{
    *outValue = SYSBVM_NULL_TUPLE;
    if(!sysbvm_tuple_isNonNullPointer(dictionary))
        return false;

    intptr_t elementIndex = sysbvm_methodDictionary_scanFor(dictionary, element);
    if(elementIndex < 0)
        return false;

    sysbvm_dictionary_t *dictionaryObject = (sysbvm_dictionary_t*)dictionary;
    sysbvm_array_t *storage = (sysbvm_array_t*)dictionaryObject->storage;
    if(storage->elements[elementIndex*2] == SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE)
        return false;

    *outValue = storage->elements[elementIndex*2 + 1];
    return true;
}